

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.cc
# Opt level: O2

void __thiscall draco::Decoder::SetSkipAttributeTransform(Decoder *this,Type att_type)

{
  allocator<char> local_3d;
  Type att_type_local;
  string local_38;
  
  att_type_local = att_type;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"skip_attribute_transform",&local_3d);
  DracoOptions<draco::GeometryAttribute::Type>::SetAttributeBool
            (&this->options_,&att_type_local,&local_38,true);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void Decoder::SetSkipAttributeTransform(GeometryAttribute::Type att_type) {
  options_.SetAttributeBool(att_type, "skip_attribute_transform", true);
}